

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

void doREPL(lua_State *L)

{
  char *pcVar1;
  char *oldprogname;
  int status;
  lua_State *L_local;
  
  pcVar1 = progname;
  progname = (char *)0x0;
  _rl_readline_name = "lua";
  while (oldprogname._4_4_ = loadline(L), oldprogname._4_4_ != -1) {
    if (oldprogname._4_4_ == 0) {
      oldprogname._4_4_ = docall(L,0,-1);
    }
    if (oldprogname._4_4_ == 0) {
      l_print(L);
    }
    else {
      report(L,oldprogname._4_4_);
    }
  }
  lua_settop(L,0);
  fwrite(anon_var_dwarf_7790 + 5,1,1,_stdout);
  fflush(_stdout);
  progname = pcVar1;
  return;
}

Assistant:

static void doREPL (lua_State *L) {
  int status;
  const char *oldprogname = progname;
  progname = NULL;  /* no 'progname' on errors in interactive mode */
  lua_initreadline(L);
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK)
      status = docall(L, 0, LUA_MULTRET);
    if (status == LUA_OK) l_print(L);
    else report(L, status);
  }
  lua_settop(L, 0);  /* clear stack */
  lua_writeline();
  progname = oldprogname;
}